

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall
CMU462::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *this_00;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *this_01;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *this_02;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *this_03;
  size_t *psVar1;
  undefined8 *puVar2;
  _Rb_tree_header *p_Var3;
  pointer puVar4;
  unsigned_long uVar5;
  HalfedgeMesh *pHVar6;
  HalfedgeMesh *pHVar7;
  _List_node_base *p_Var8;
  pointer pVVar9;
  undefined8 uVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *pvVar13;
  _Self __tmp;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  iterator iVar16;
  _Base_ptr p_Var17;
  mapped_type *pmVar18;
  _Base_ptr p_Var19;
  long lVar20;
  FaceIter FVar21;
  _List_node_base *p_Var22;
  _List_node_base *p_Var23;
  ostream *poVar24;
  _Rb_tree_header *p_Var25;
  ulong uVar26;
  long lVar27;
  HalfedgeMesh *pHVar28;
  pointer pvVar29;
  pointer pvVar30;
  mapped_type mVar31;
  pointer puVar32;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar33;
  long lVar34;
  bool bVar35;
  HalfedgeIter hab;
  VertexIter v;
  IndexPair ab;
  Index a;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  pairToHalfedge;
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  indexToVertex;
  IndexPair ba;
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  _List_iterator<CMU462::Halfedge> local_150;
  key_type local_148;
  iterator iStack_140;
  _List_iterator<CMU462::Halfedge> *local_138;
  _List_node_base *local_128;
  key_type local_120;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_110;
  _List_node_base *local_108;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_100;
  _List_node_base *local_f8;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *local_f0;
  _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  local_e8;
  pointer local_b8;
  pointer local_b0;
  long local_a8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  local_a0;
  key_type local_70;
  _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  local_60;
  
  local_100 = vertexPositions;
  std::__cxx11::_List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::_M_clear
            ((_List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_> *)this);
  (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
  _M_node._M_size = 0;
  this_00 = &this->vertices;
  std::__cxx11::_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::_M_clear
            (&this_00->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>);
  (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
  ._M_size = 0;
  this_01 = &this->edges;
  local_f8 = (_List_node_base *)this_00;
  std::__cxx11::_List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>::_M_clear
            (&this_01->super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>);
  (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  _M_size = 0;
  this_02 = &this->faces;
  local_f0 = this_01;
  std::__cxx11::_List_base<CMU462::Face,_std::allocator<CMU462::Face>_>::_M_clear
            (&this_02->super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>);
  (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_02;
  (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_02;
  (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  _M_size = 0;
  this_03 = &this->boundaries;
  local_128 = (_List_node_base *)this_02;
  std::__cxx11::_List_base<CMU462::Face,_std::allocator<CMU462::Face>_>::_M_clear
            (&this_03->super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>);
  (this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_03;
  (this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_03;
  (this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  _M_size = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar30 = (polygons->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar29 = (polygons->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_110 = polygons;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pvVar30 != pvVar29) {
    do {
      if ((ulong)((long)(pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start) < 0x11) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                   ,0x5b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0017f7dd;
      }
      local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_e8._M_impl.super__Rb_tree_header._M_header;
      local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
      for (puVar32 = (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          puVar4 = (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish, puVar32 != puVar4;
          puVar32 = puVar32 + 1) {
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&local_e8,puVar32);
        p_Var17 = &local_a0._M_impl.super__Rb_tree_header._M_header;
        if (local_a0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var19 = local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (*(ulong *)(p_Var19 + 1) >= *puVar32) {
              p_Var17 = p_Var19;
            }
            p_Var19 = (&p_Var19->_M_left)[*(ulong *)(p_Var19 + 1) < *puVar32];
          } while (p_Var19 != (_Base_ptr)0x0);
        }
        p_Var3 = &local_a0._M_impl.super__Rb_tree_header;
        p_Var25 = p_Var3;
        if (((_Rb_tree_header *)p_Var17 != p_Var3) &&
           (p_Var25 = (_Rb_tree_header *)p_Var17,
           *puVar32 < ((_Rb_tree_header *)p_Var17)->_M_node_count)) {
          p_Var25 = p_Var3;
        }
        if (p_Var25 == p_Var3) {
          local_148._M_node = (_List_node_base *)newVertex(this);
          local_148._M_node[0xf]._M_prev = (_List_node_base *)this;
          pmVar14 = std::
                    map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                  *)&local_a0,puVar32);
          pmVar14->_M_node = local_148._M_node;
          pmVar15 = std::
                    map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                    ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                  *)&local_60,&local_148);
          *pmVar15 = 1;
        }
        else {
          pmVar14 = std::
                    map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                  *)&local_a0,puVar32);
          pmVar15 = std::
                    map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                    ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                  *)&local_60,pmVar14);
          *pmVar15 = *pmVar15 + 1;
        }
      }
      if (local_e8._M_impl.super__Rb_tree_header._M_node_count <
          (ulong)((long)puVar4 -
                  (long)(pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                   ,0x66);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"(vertex indices:",0x10);
        puVar32 = (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (puVar32 !=
            (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            puVar32 = puVar32 + 1;
          } while (puVar32 !=
                   (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,")",1);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0017f7dd;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_e8);
      pvVar30 = pvVar30 + 1;
      pvVar29 = (local_110->
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (pvVar30 != pvVar29);
  }
  pvVar33 = local_110;
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::resize
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)local_128,
             ((long)pvVar29 -
              (long)(local_110->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pvVar30 = (pvVar33->
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pvVar30 !=
      (pvVar33->
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pvVar30 = pvVar30 + 1) {
    local_128 = local_128->_M_next;
    local_148._M_node = (_List_node_base *)0x0;
    iStack_140._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
    local_138 = (_List_iterator<CMU462::Halfedge> *)0x0;
    local_b0 = (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_b8 = (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    lVar27 = (long)local_b8 - (long)local_b0 >> 3;
    if (local_b8 != local_b0) {
      local_a8 = -(ulong)(lVar27 == 0) - lVar27;
      lVar34 = 1;
      do {
        puVar32 = (pvVar30->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        local_120.first = puVar32[lVar34 + -1];
        lVar20 = 0;
        if (lVar27 != lVar34) {
          lVar20 = lVar34;
        }
        uVar5 = puVar32[lVar20];
        local_150._M_node = (_List_node_base *)0x0;
        local_120.second = uVar5;
        local_108 = (_List_node_base *)local_120.first;
        iVar16 = std::
                 _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                 ::find(&local_e8,&local_120);
        if ((_Rb_tree_header *)iVar16._M_node != &local_e8._M_impl.super__Rb_tree_header) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                     ,0x58);
          poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,", ",2);
          poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)poVar24);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,").",2);
          std::endl<char,std::char_traits<char>>(poVar24);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                     ,0x67);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                     ,0x6f);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"not consistently oriented.",0x1a);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          goto LAB_0017f7dd;
        }
        p_Var17 = (_Base_ptr)operator_new(0x40);
        p_Var17->_M_left = (_Base_ptr)&PTR_centroid_00271d18;
        p_Var17->_M_right = (_Base_ptr)0x0;
        *(_List_node_base **)&p_Var17[1]._M_color = (_List_node_base *)0x0;
        p_Var17[1]._M_parent = (_Base_ptr)0x0;
        p_Var17[1]._M_left = (_Base_ptr)0x0;
        p_Var17[1]._M_right = (_Base_ptr)0x0;
        std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var17);
        psVar1 = &(this->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_150._M_node = (_List_node_base *)p_Var17;
        pmVar18 = std::
                  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                  ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                                *)&local_e8,&local_120);
        pmVar18->_M_node = local_150._M_node;
        local_150._M_node[3]._M_prev = local_128;
        local_128[0xb]._M_prev = local_150._M_node;
        pmVar14 = std::
                  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                  ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                *)&local_a0,(key_type_conflict1 *)&local_108);
        p_Var17 = (_Base_ptr)pmVar14->_M_node;
        ((_Base_ptr)(local_150._M_node + 2))->_M_parent = p_Var17;
        p_Var17[7]._M_right = (_Base_ptr)local_150._M_node;
        if (iStack_140._M_current == local_138) {
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                    ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                      *)&local_148,iStack_140,&local_150);
        }
        else {
          (iStack_140._M_current)->_M_node = local_150._M_node;
          iStack_140._M_current = iStack_140._M_current + 1;
        }
        local_70.second = (unsigned_long)local_108;
        local_70.first = uVar5;
        iVar16 = std::
                 _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                 ::find(&local_e8,&local_70);
        if ((_Rb_tree_header *)iVar16._M_node == &local_e8._M_impl.super__Rb_tree_header) {
          local_150._M_node[1]._M_prev = (_List_node_base *)this;
        }
        else {
          p_Var17 = iVar16._M_node[1]._M_left;
          local_150._M_node[1]._M_prev = (_List_node_base *)p_Var17;
          p_Var17->_M_right = (_Base_ptr)local_150._M_node;
          p_Var19 = (_Base_ptr)operator_new(0x70);
          p_Var19->_M_left = (_Base_ptr)&PTR_centroid_00271dd8;
          *(undefined8 *)&p_Var19[2]._M_color = 0;
          p_Var19[2]._M_parent = (_Base_ptr)0x0;
          p_Var19[2]._M_left = (_Base_ptr)0x0;
          p_Var19[2]._M_right = (_Base_ptr)0x0;
          *(undefined8 *)&p_Var19[3]._M_color = 0;
          p_Var19[3]._M_parent = (_Base_ptr)0x0;
          p_Var19->_M_right = (_Base_ptr)0x0;
          *(undefined8 *)&p_Var19[1]._M_color = 0;
          p_Var19[1]._M_parent = (_Base_ptr)0x0;
          p_Var19[1]._M_left = (_Base_ptr)0x0;
          *(undefined1 *)&p_Var19[1]._M_right = 0;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var19);
          psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                    _M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_150._M_node[3]._M_next = (_List_node_base *)p_Var19;
          p_Var17[1]._M_left = p_Var19;
          p_Var19[3]._M_parent = (_Base_ptr)local_150._M_node;
        }
        lVar20 = local_a8 + lVar34;
        lVar34 = lVar34 + 1;
      } while (lVar20 != 0);
    }
    pvVar33 = local_110;
    if (local_b8 != local_b0) {
      lVar34 = 1;
      do {
        lVar20 = 0;
        if (lVar27 != lVar34) {
          lVar20 = lVar34;
        }
        *(_List_node_base **)(*(long *)((long)local_148._M_node + lVar34 * 8 + -8) + 0x20) =
             (&(local_148._M_node)->_M_next)[lVar20];
        lVar20 = (-(ulong)(lVar27 == 0) - lVar27) + lVar34;
        lVar34 = lVar34 + 1;
      } while (lVar20 != 0);
    }
    if (local_148._M_node != (_List_node_base *)0x0) {
      operator_delete(local_148._M_node);
    }
  }
  for (p_Var22 = local_f8->_M_next; p_Var22 != local_f8; p_Var22 = p_Var22->_M_next) {
    p_Var23 = p_Var22[0xf]._M_prev;
    do {
      if ((HalfedgeMesh *)p_Var23[1]._M_prev == this) {
        p_Var22[0xf]._M_prev = p_Var23;
        break;
      }
      p_Var23 = (((HalfedgeMesh *)p_Var23[1]._M_prev)->vertices).
                super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                super__List_node_base._M_prev;
    } while (p_Var22[0xf]._M_prev != p_Var23);
  }
  p_Var22 = local_f8;
  for (pHVar6 = (HalfedgeMesh *)
                (this->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node.super__List_node_base._M_next; pHVar6 != this;
      pHVar6 = (HalfedgeMesh *)
               (pHVar6->halfedges).
               super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node
               .super__List_node_base._M_next) {
    if ((HalfedgeMesh *)
        (pHVar6->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl
        ._M_node.super__List_node_base._M_next == this) {
      FVar21 = newBoundary(this);
      local_148._M_node = (_List_node_base *)0x0;
      iStack_140._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
      local_138 = (_List_iterator<CMU462::Halfedge> *)0x0;
      pHVar28 = pHVar6;
      do {
        p_Var22 = (_List_node_base *)operator_new(0x40);
        p_Var22[1]._M_next = (_List_node_base *)&PTR_centroid_00271d18;
        p_Var22[1]._M_prev = (_List_node_base *)0x0;
        p_Var22[2]._M_next = (_List_node_base *)0x0;
        p_Var22[2]._M_prev = (_List_node_base *)0x0;
        p_Var22[3]._M_next = (_List_node_base *)0x0;
        p_Var22[3]._M_prev = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var22);
        psVar1 = &(this->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_120.first = (unsigned_long)p_Var22;
        if (iStack_140._M_current == local_138) {
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                    ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                      *)&local_148,iStack_140,(_List_iterator<CMU462::Halfedge> *)&local_120);
        }
        else {
          (iStack_140._M_current)->_M_node = p_Var22;
          iStack_140._M_current = iStack_140._M_current + 1;
        }
        (pHVar28->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_120.first;
        ((_List_node_base *)(local_120.first + 0x10))->_M_prev = (_List_node_base *)pHVar28;
        ((_List_node_base *)(local_120.first + 0x30))->_M_prev = FVar21._M_node;
        ((_List_node_base *)(local_120.first + 0x20))->_M_prev =
             (pHVar28->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
             _M_impl._M_node.super__List_node_base._M_prev[2]._M_prev;
        p_Var23 = (_List_node_base *)operator_new(0x70);
        p_Var23[1]._M_next = (_List_node_base *)&PTR_centroid_00271dd8;
        p_Var23[4]._M_next = (_List_node_base *)0x0;
        p_Var23[4]._M_prev = (_List_node_base *)0x0;
        p_Var23[5]._M_next = (_List_node_base *)0x0;
        p_Var23[5]._M_prev = (_List_node_base *)0x0;
        p_Var23[6]._M_next = (_List_node_base *)0x0;
        p_Var23[6]._M_prev = (_List_node_base *)0x0;
        p_Var23[1]._M_prev = (_List_node_base *)0x0;
        p_Var23[2]._M_next = (_List_node_base *)0x0;
        p_Var23[2]._M_prev = (_List_node_base *)0x0;
        p_Var23[3]._M_next = (_List_node_base *)0x0;
        *(undefined1 *)&p_Var23[3]._M_prev = 0;
        std::__detail::_List_node_base::_M_hook(p_Var23);
        p_Var22 = local_f8;
        psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var23[6]._M_prev = (_List_node_base *)pHVar28;
        (pHVar28->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
        _M_node.super__List_node_base._M_next = p_Var23;
        ((_List_node_base *)(local_120.first + 0x30))->_M_next = p_Var23;
        pHVar28 = (HalfedgeMesh *)
                  (pHVar28->vertices).
                  super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                  super__List_node_base._M_prev;
        bVar35 = pHVar6 == pHVar28;
        if (bVar35) break;
        pHVar7 = (HalfedgeMesh *)
                 (pHVar28->vertices).
                 super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        while (pHVar7 != this) {
          pHVar28 = (HalfedgeMesh *)
                    (pHVar28->vertices).
                    super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
                    _M_node.super__List_node_base._M_next[2]._M_next;
          bVar35 = pHVar6 == pHVar28;
          if (bVar35) goto LAB_0017f43a;
          pHVar7 = (HalfedgeMesh *)
                   (pHVar28->vertices).
                   super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
                   .super__List_node_base._M_next;
        }
      } while (!bVar35);
LAB_0017f43a:
      FVar21._M_node[0xb]._M_prev = (local_148._M_node)->_M_next;
      if ((long)iStack_140._M_current - (long)local_148._M_node != 0) {
        uVar26 = (long)iStack_140._M_current - (long)local_148._M_node >> 3;
        lVar27 = 0;
        do {
          (&(local_148._M_node)->_M_next)[lVar27][2]._M_next =
               (&(local_148._M_node)->_M_next)[((uVar26 - 1) + lVar27) % uVar26];
          lVar27 = lVar27 + 1;
        } while (uVar26 + (uVar26 == 0) != lVar27);
      }
      operator_delete(local_148._M_node);
    }
  }
  p_Var23 = p_Var22->_M_next;
  while (p_Var23 != p_Var22) {
    p_Var8 = p_Var23->_M_next;
    p_Var23[0xf]._M_prev = p_Var23[0xf]._M_prev[1]._M_prev[2]._M_next;
    p_Var23 = p_Var8;
  }
  local_148._M_node = p_Var22->_M_next;
  if (local_148._M_node != p_Var22) {
    do {
      if ((HalfedgeMesh *)local_148._M_node[0xf]._M_prev == this) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                   ,0x5c);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0017f7dd;
      }
      mVar31 = 0;
      p_Var23 = local_148._M_node[0xf]._M_prev;
      do {
        mVar31 = mVar31 + ((ulong)*(byte *)&p_Var23[3]._M_prev[0xc]._M_next ^ 1);
        p_Var23 = p_Var23[1]._M_prev[2]._M_next;
      } while (local_148._M_node[0xf]._M_prev != p_Var23);
      pmVar15 = std::
                map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                              *)&local_60,&local_148);
      if (mVar31 != *pmVar15) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                   ,0x58);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_0017f7dd;
      }
      local_148._M_node = (local_148._M_node)->_M_next;
    } while (local_148._M_node != p_Var22);
  }
  pvVar13 = local_100;
  if ((this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node._M_size <=
      (ulong)(((long)(local_100->
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_100->
                     super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    p_Var3 = &local_a0._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
      lVar27 = 0;
      p_Var17 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var19 = p_Var17[1]._M_parent;
        pVVar9 = (pvVar13->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        p_Var19[1]._M_parent = *(_Base_ptr *)((long)&pVVar9->z + lVar27);
        puVar2 = (undefined8 *)((long)&pVVar9->x + lVar27);
        uVar10 = puVar2[1];
        p_Var19->_M_right = (_Base_ptr)*puVar2;
        *(undefined8 *)(p_Var19 + 1) = uVar10;
        puVar2 = (undefined8 *)((long)&pVVar9->x + lVar27);
        p_Var11 = (_Base_ptr)*puVar2;
        p_Var12 = (_Base_ptr)puVar2[1];
        *(undefined8 *)(p_Var19 + 2) = *(undefined8 *)((long)&pVVar9->z + lVar27);
        p_Var19[1]._M_left = p_Var11;
        p_Var19[1]._M_right = p_Var12;
        p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
        lVar27 = lVar27 + 0x18;
      } while ((_Rb_tree_header *)p_Var17 != p_Var3);
    }
    std::
    _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
    ::~_Rb_tree(&local_e8);
    std::
    _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
    ::~_Rb_tree(&local_a0);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
             ,0x79);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(number of positions in input: ",0x1f);
  poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar24,")",1);
  std::endl<char,std::char_traits<char>>(poVar24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(  number of vertices in mesh: ",0x1f);
  poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar24,")",1);
  std::endl<char,std::char_traits<char>>(poVar24);
LAB_0017f7dd:
  exit(1);
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
                         const vector<Vector3D>& vertexPositions)
// This method initializes the halfedge data structure from a raw list of
// polygons, where each input polygon is specified as a list of vertex indices.
// The input must describe a manifold, oriented surface, where the orientation
// of a polygon is determined by the order of vertices in the list. Polygons
// must have at least three vertices.  Note that there are no special conditions
// on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
// the collection of indices have to be contiguous.  Overall, this initializer
// is designed to be robust but perhaps not incredibly fast (though of course
// this does not affect the performance of the resulting data structure).  One
// could also implement faster initializers that handle important special cases
// (e.g., all triangles, or data that is known to be manifold). Since there are
// no strong conditions on the indices of polygons, we assume that the list of
// vertex positions is given in lexicographic order (i.e., that the lowest index
// appearing in any polygon corresponds to the first entry of the list of
// positions and so on).
{
  // define some types, to improve readability
  typedef vector<Index> IndexList;
  typedef IndexList::const_iterator IndexListCIter;
  typedef vector<IndexList> PolygonList;
  typedef PolygonList::const_iterator PolygonListCIter;
  typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
                                         // corresponding to an edge of an
                                         // oriented polygon

  // Clear any existing elements.
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Since the vertices in our halfedge mesh are stored in a linked list,
  // we will temporarily need to keep track of the correspondence between
  // indices of vertices in our input and pointers to vertices in the new
  // mesh (which otherwise can't be accessed by index).  Note that since
  // we're using a general-purpose map (rather than, say, a vector), we can
  // be a bit more flexible about the indexing scheme: input vertex indices
  // aren't required to be 0-based or 1-based; in fact, the set of indices
  // doesn't even have to be contiguous.  Taking advantage of this fact makes
  // our conversion a bit more robust to different types of input, including
  // data that comes from a subset of a full mesh.

  // maps a vertex index to the corresponding vertex
  map<Index, VertexIter> indexToVertex;

  // Also store the vertex degree, i.e., the number of polygons that use each
  // vertex; this information will be used to check that the mesh is manifold.
  map<VertexIter, Size> vertexDegree;

  // First, we do some basic sanity checks on the input.
  for (PolygonListCIter p = polygons.begin(); p != polygons.end(); p++) {
    if (p->size() < 3) {
      // Refuse to build the mesh if any of the polygons have fewer than three
      // vertices.(Note that if we omit this check the code will still
      // constructsomething fairlymeaningful for 1- and 2-point polygons, but
      // enforcing this stricterrequirementon the input will help simplify code
      // further downstream, since it canbe certainit doesn't have to check for
      // these rather degenerate cases.)
      cerr << "Error converting polygons to halfedge mesh: each polygon must "
              "have at least three vertices."
           << endl;
      exit(1);
    }

    // We want to count the number of distinct vertex indices in this
    // polygon, to make sure it's the same as the number of vertices
    // in the polygon---if they disagree, then the polygon is not valid
    // (or at least, for simplicity we don't handle polygons of this type!).
    set<Index> polygonIndices;

    // loop over polygon vertices
    for (IndexListCIter i = p->begin(); i != p->end(); i++) {
      polygonIndices.insert(*i);

      // allocate one vertex for each new index we encounter
      if (indexToVertex.find(*i) == indexToVertex.end()) {
        VertexIter v = newVertex();
        v->halfedge() =
            halfedges.end();  // this vertex doesn't yet point to any halfedge
        indexToVertex[*i] = v;
        vertexDegree[v] = 1;  // we've now seen this vertex only once
      } else {
        // keep track of the number of times we've seen this vertex
        vertexDegree[indexToVertex[*i]]++;
      }

    }  // end loop over polygon vertices

    // check that all vertices of the current polygon are distinct
    Size degree = p->size();  // number of vertices in this polygon
    if (polygonIndices.size() < degree) {
      cerr << "Error converting polygons to halfedge mesh: one of the input "
              "polygons does not have distinct vertices!"
           << endl;
      cerr << "(vertex indices:";
      for (IndexListCIter i = p->begin(); i != p->end(); i++) {
        cerr << " " << *i;
      }
      cerr << ")" << endl;
      exit(1);
    }  // end check that polygon vertices are distinct

  }  // end basic sanity checks on input

  // The number of vertices in the mesh is the
  // number of unique indices seen in the input.
  Size nVertices = indexToVertex.size();

  // The number of faces is just the number of polygons in the input.
  Size nFaces = polygons.size();
  faces.resize(nFaces);  // allocate storage for faces in our new mesh

  // We will store a map from ordered pairs of vertex indices to
  // the corresponding halfedge object in our new (halfedge) mesh;
  // this map gets constructed during the next loop over polygons.
  map<IndexPair, HalfedgeIter> pairToHalfedge;

  // Next, we actually build the halfedge connectivity by again looping over
  // polygons
  PolygonListCIter p;
  FaceIter f;
  for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
    vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
                                         // edges of this face
    Size degree = p->size();             // number of vertices in this polygon

    // loop over the halfedges of this face (equivalently, the ordered pairs of
    // consecutive vertices)
    for (Index i = 0; i < degree; i++) {
      Index a = (*p)[i];                 // current index
      Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
      IndexPair ab(a, b);
      HalfedgeIter hab;

      // check if this halfedge already exists; if so, we have a problem!
      if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
        cerr << "Error converting polygons to halfedge mesh: found multiple "
                "oriented edges with indices ("
             << a << ", " << b << ")." << endl;
        cerr << "This means that either (i) more than two faces contain this "
                "edge (hence the surface is nonmanifold), or"
             << endl;
        cerr << "(ii) there are exactly two faces containing this edge, but "
                "they have the same orientation (hence the surface is"
             << endl;
        cerr << "not consistently oriented." << endl;
        exit(1);
      } else  // otherwise, the halfedge hasn't been allocated yet
      {
        // so, we point this vertex pair to a new halfedge
        hab = newHalfedge();
        pairToHalfedge[ab] = hab;

        // link the new halfedge to its face
        hab->face() = f;
        hab->face()->halfedge() = hab;

        // also link it to its starting vertex
        hab->vertex() = indexToVertex[a];
        hab->vertex()->halfedge() = hab;

        // keep a list of halfedges in this face, so that we can later
        // link them together in a loop (via their "next" pointers)
        faceHalfedges.push_back(hab);
      }

      // Also, check if the twin of this halfedge has already been constructed
      // (during construction of a different face).  If so, link the twins
      // together and allocate their shared halfedge.  By the end of this pass
      // over polygons, the only halfedges that will not have a twin will hence
      // be those that sit along the domain boundary.
      IndexPair ba(b, a);
      map<IndexPair, HalfedgeIter>::iterator iba = pairToHalfedge.find(ba);
      if (iba != pairToHalfedge.end()) {
        HalfedgeIter hba = iba->second;

        // link the twins
        hab->twin() = hba;
        hba->twin() = hab;

        // allocate and link their edge
        EdgeIter e = newEdge();
        hab->edge() = e;
        hba->edge() = e;
        e->halfedge() = hab;
      } else {  // If we didn't find a twin...
        // ...mark this halfedge as being twinless by pointing
        // it to the end of the list of halfedges. If it remains
        // twinless by the end of the current loop over polygons,
        // it will be linked to a boundary face in the next pass.
        hab->twin() = halfedges.end();
      }

    }  // end loop over the current polygon's halfedges

    // Now that all the halfedges of this face have been allocated,
    // we can link them together via their "next" pointers.
    for (Index i = 0; i < degree; i++) {
      Index j =
          (i + 1) % degree;  // index of the next halfedge, in cyclic order
      faceHalfedges[i]->next() = faceHalfedges[j];
    }

  }  // done building basic halfedge connectivity

  // For each vertex on the boundary, advance its halfedge pointer to one that
  // is also on the boundary.
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    // loop over halfedges around vertex
    HalfedgeIter h = v->halfedge();
    do {
      if (h->twin() == halfedges.end()) {
        v->halfedge() = h;
        break;
      }

      h = h->twin()->next();
    } while (h != v->halfedge());  // end loop over halfedges around vertex

  }  // done advancing halfedge pointers for boundary vertices

  // Next we construct new faces for each boundary component.
  for (HalfedgeIter h = halfedgesBegin(); h != halfedgesEnd();
       h++)  // loop over all halfedges
  {
    // Any halfedge that does not yet have a twin is on the boundary of the
    // domain. If we follow the boundary around long enough we will of course
    // eventually make a closed loop; we can represent this boundary loop by a
    // new face. To make clear the distinction between faces and boundary loops,
    // the boundary face will (i) have a flag indicating that it is a boundary
    // loop, and (ii) be stored in a list of boundaries, rather than the usual
    // list of faces.  The reason we need the both the flag *and* the separate
    // list is that faces are often accessed in two fundamentally different
    // ways: either by (i) local traversal of the neighborhood of some mesh
    // element using the halfedge structure, or (ii) global traversal of all
    // faces (or boundary loops).
    if (h->twin() == halfedges.end()) {
      FaceIter b = newBoundary();
      vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
                                               // the boundary, so we can link
                                               // them together

      // We now need to walk around the boundary, creating new
      // halfedges and edges along the boundary loop as we go.
      HalfedgeIter i = h;
      do {
        // create a twin, which becomes a halfedge of the boundary loop
        HalfedgeIter t = newHalfedge();
        boundaryHalfedges.push_back(
            t);  // keep a list of all boundary halfedges, in cyclic order
        i->twin() = t;
        t->twin() = i;
        t->face() = b;
        t->vertex() = i->next()->vertex();

        // create the shared edge
        EdgeIter e = newEdge();
        e->halfedge() = i;
        i->edge() = e;
        t->edge() = e;

        // Advance i to the next halfedge along the current boundary loop
        // by walking around its target vertex and stopping as soon as we
        // find a halfedge that does not yet have a twin defined.
        i = i->next();
        while (i != h &&  // we're done if we end up back at the beginning of
                          // the loop
               i->twin() != halfedges.end())  // otherwise, we're looking for
                                              // the next twinless halfedge
                                              // along the loop
        {
          i = i->twin();
          i = i->next();
        }
      } while (i != h);

      b->halfedge() = boundaryHalfedges.front();

      // The only pointers that still need to be set are the "next" pointers of
      // the twins; these we can set from the list of boundary halfedges, but we
      // must use the opposite order from the order in the list, since the
      // orientation of the boundary loop is opposite the orientation of the
      // halfedges "inside" the domain boundary.
      Size degree = boundaryHalfedges.size();
      for (Index p = 0; p < degree; p++) {
        Index q = (p - 1 + degree) % degree;
        boundaryHalfedges[p]->next() = boundaryHalfedges[q];
      }

    }  // end construction of one of the boundary loops

    // Note that even though we are looping over all halfedges, we will still
    // construct the appropriate number of boundary loops (and not, say, one
    // loop per boundary halfedge).  The reason is that as we continue to
    // iterate through halfedges, we check whether their twin has been assigned,
    // and since new twins may have been assigned earlier in this loop, we will
    // end up skipping many subsequent halfedges.

  }  // done adding "virtual" faces corresponding to boundary loops

  // To make later traversal of the mesh easier, we will now advance the
  // halfedge
  // associated with each vertex such that it refers to the *first* non-boundary
  // halfedge, rather than the last one.
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    v->halfedge() = v->halfedge()->twin()->next();
  }

  // Finally, we check that all vertices are manifold.
  for (VertexIter v = vertices.begin(); v != vertices.end(); v++) {
    // First check that this vertex is not a "floating" vertex;
    // if it is then we do not have a valid 2-manifold surface.
    if (v->halfedge() == halfedges.end()) {
      cerr << "Error converting polygons to halfedge mesh: some vertices are "
              "not referenced by any polygon."
           << endl;
      exit(1);
    }

    // Next, check that the number of halfedges emanating from this vertex in
    // our half edge data structure equals the number of polygons containing
    // this vertex, which we counted during our first pass over the mesh.  If
    // not, then our vertex is not a "fan" of polygons, but instead has some
    // other (nonmanifold) structure.
    Size count = 0;
    HalfedgeIter h = v->halfedge();
    do {
      if (!h->face()->isBoundary()) {
        count++;
      }
      h = h->twin()->next();
    } while (h != v->halfedge());

    if (count != vertexDegree[v]) {
      cerr << "Error converting polygons to halfedge mesh: at least one of the "
              "vertices is nonmanifold."
           << endl;
      exit(1);
    }
  }  // end loop over vertices

  // Now that we have the connectivity, we copy the list of vertex
  // positions into member variables of the individual vertices.
  if (vertexPositions.size() < vertices.size()) {
    cerr << "Error converting polygons to halfedge mesh: number of vertex "
            "positions is different from the number of distinct vertices!"
         << endl;
    cerr << "(number of positions in input: " << vertexPositions.size() << ")"
         << endl;
    cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
    exit(1);
  }
  // Since an STL map internally sorts its keys, we can iterate over the map
  // from vertex indices to vertex iterators to visit our (input) vertices in
  // lexicographic order
  int i = 0;
  for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
       e != indexToVertex.end(); e++) {
    // grab a pointer to the vertex associated with the current key (i.e., the
    // current index)
    VertexIter v = e->second;

    // set the att of this vertex to the corresponding
    // position in the input
    v->position = vertexPositions[i];
    v->bindPosition = v->position;
    i++;
  }

}